

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

optional<tinyusdz::ascii::AsciiParser::VariableDef> * __thiscall
tinyusdz::ascii::AsciiParser::GetPrimMetaDefinition
          (optional<tinyusdz::ascii::AsciiParser::VariableDef> *__return_storage_ptr__,
          AsciiParser *this,string *name)

{
  const_iterator cVar1;
  mapped_type *rhs;
  
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
          ::find(&(this->_supported_prim_metas)._M_t,name);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x60) = 0;
  }
  else {
    rhs = ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
          ::at(&this->_supported_prim_metas,name);
    __return_storage_ptr__->has_value_ = true;
    VariableDef::VariableDef((VariableDef *)&__return_storage_ptr__->contained,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<AsciiParser::VariableDef> AsciiParser::GetPrimMetaDefinition(
    const std::string &name) {
  if (_supported_prim_metas.count(name)) {
    return _supported_prim_metas.at(name);
  }

  return nonstd::nullopt;
}